

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_rng.c
# Opt level: O1

err_t cmdRngStart(bool_t verbose)

{
  bool_t bVar1;
  err_t eVar2;
  err_t eVar3;
  size_t sVar4;
  size_t sVar5;
  tm_ticks_t *data;
  long lVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  tm_ticks_t *state;
  bool bVar10;
  size_t read;
  size_t local_38;
  
  eVar2 = 0;
  bVar1 = rngIsValid();
  if (bVar1 == 0) {
    if (verbose != 0) {
      printf("Starting RNG[");
      lVar6 = 0;
      lVar7 = 0;
      do {
        eVar2 = rngESRead(&local_38,(void *)0x0,0,
                          *(char **)((long)&PTR_anon_var_dwarf_4b30_0014f860 + lVar6));
        lVar8 = lVar7;
        if (eVar2 == 0) {
          lVar8 = lVar7 + 1;
          pcVar9 = ", %s";
          if (lVar7 == 0) {
            pcVar9 = "%s";
          }
          printf(pcVar9);
        }
        lVar6 = lVar6 + 8;
        lVar7 = lVar8;
      } while (lVar6 != 0x28);
      printf("]... ");
    }
    eVar2 = rngESHealth();
    if (eVar2 == 0x12f) {
      sVar4 = beltHash_keep();
      sVar5 = prngEcho_keep();
      if (sVar5 < sVar4) {
        sVar4 = beltHash_keep();
      }
      else {
        sVar4 = prngEcho_keep();
      }
      data = (tm_ticks_t *)blobCreate(sVar4 + 0x400);
      if (data == (tm_ticks_t *)0x0) {
        eVar2 = 0x6e;
        bVar10 = false;
        eVar3 = 0x6e;
      }
      else {
        eVar3 = cmdRngKbRead(data);
        bVar10 = eVar3 == 0;
        eVar2 = eVar3;
        if (bVar10) {
          state = data + 0x80;
          beltHashStart(state);
          beltHashStepH(data,0x400,state);
          beltHashStepG((octet *)data,state);
          prngEchoStart(state,data,0x20);
          eVar2 = rngCreate(prngEchoRead,state);
        }
        blobClose(data);
      }
      if (!bVar10) {
        return eVar3;
      }
    }
    else if (eVar2 == 0) {
      eVar2 = rngCreate((read_i)0x0,(void *)0x0);
    }
    if (verbose != 0) {
      pcVar9 = errMsg(eVar2);
      puts(pcVar9);
    }
  }
  return eVar2;
}

Assistant:

err_t cmdRngStart(bool_t verbose)
{
	err_t code;
	// ГСЧ уже запущен?
	if (rngIsValid())
		return ERR_OK;
	// печать информации об источниках
	if (verbose)
	{
		const char* sources[] = { "trng", "trng2", "sys", "sys2", "timer" };
		size_t pos;
		size_t count;
		size_t read;
		printf("Starting RNG[");
		for (pos = count = 0; pos < COUNT_OF(sources); ++pos)
			if (rngESRead(&read, 0, 0, sources[pos]) == ERR_OK)
				printf(count++ ? ", %s" : "%s", sources[pos]);
		printf("]... ");
	}
	// энтропии достаточно?
	code = rngESHealth();
	if (code == ERR_OK)
		code = rngCreate(0, 0);
	// нет, подключить клавиатурный источник
	else if (code == ERR_NOT_ENOUGH_ENTROPY)
	{
		void* stack;
		tm_ticks_t* data;
		octet* hash;
		void* state;
		// выделить и разметить память
		code = cmdBlobCreate(stack, 128 * sizeof(tm_ticks_t) +
			MAX2(beltHash_keep(), prngEcho_keep()));
		ERR_CALL_CHECK(code);
		data = (tm_ticks_t*)stack;
		hash = (octet*)data;
		state = data + 128;
		// собрать данные от клавиатурного источника
		code = cmdRngKbRead(data);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// хэшировать
		beltHashStart(state);
		beltHashStepH(data, 128 * sizeof(tm_ticks_t), state);
		beltHashStepG(hash, state);
		// запустить echo-генератор
		prngEchoStart(state, hash, 32);
		// запустить генератор
		code = rngCreate(prngEchoRead, state);
		// освободить память
		cmdBlobClose(stack);
	}
	if (verbose)
		printf("%s\n", errMsg(code));
	return code;
}